

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<LibrarySearchPath>::relocate
          (QArrayDataPointer<LibrarySearchPath> *this,qsizetype offset,LibrarySearchPath **data)

{
  bool bVar1;
  LibrarySearchPath *in_RDX;
  long in_RSI;
  LibrarySearchPath *in_RDI;
  LibrarySearchPath **unaff_retaddr;
  LibrarySearchPath *res;
  char16_t *n;
  LibrarySearchPath *c;
  
  n = (in_RDI->super_QMakeLocalFileName).real_name.d.ptr + in_RSI * 0x1c;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<LibrarySearchPath,long_long>(in_RDX,(longlong)n,in_RDI);
  if ((in_RDX != (LibrarySearchPath *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<LibrarySearchPath>,LibrarySearchPath_const*>
                        (unaff_retaddr,(QArrayDataPointer<LibrarySearchPath> *)c), bVar1)) {
    (in_RDX->super_QMakeLocalFileName).real_name.d.d =
         (Data *)(in_RSI * 0x38 + (long)(in_RDX->super_QMakeLocalFileName).real_name.d.d);
  }
  (in_RDI->super_QMakeLocalFileName).real_name.d.ptr = n;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }